

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

string * __thiscall
lest::to_string<std::optional<long>,std::optional<int>>
          (string *__return_storage_ptr__,lest *this,optional<long> *lhs,string *op,
          optional<int> *rhs)

{
  ostream *poVar1;
  optional<long> *value;
  optional<int> *value_00;
  ostringstream os;
  string sStack_1d8;
  string local_1b8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  string_maker<std::optional<long>>::to_string_abi_cxx11_
            (&local_1b8,(string_maker<std::optional<long>> *)this,value);
  poVar1 = std::operator<<((ostream *)local_198,(string *)&local_1b8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," ");
  string_maker<std::optional<int>>::to_string_abi_cxx11_
            (&sStack_1d8,(string_maker<std::optional<int>> *)op,value_00);
  std::operator<<(poVar1,(string *)&sStack_1d8);
  std::__cxx11::string::~string((string *)&sStack_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}